

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib571.c
# Opt level: O1

size_t rtp_write(void *ptr,size_t size,size_t nmemb,void *stream)

{
  long *__s2;
  uint uVar1;
  undefined1 uVar2;
  ushort uVar3;
  int iVar4;
  size_t sVar5;
  long lVar6;
  size_t __n;
  uint uVar7;
  
  uVar2 = *(undefined1 *)((long)ptr + 1);
  uVar3 = *(ushort *)((long)ptr + 2);
  sVar5 = (size_t)(nmemb == 0 || size == 0);
  iVar4 = curlx_uztosi(nmemb * size);
  uVar1 = iVar4 - 4;
  curl_mprintf("RTP: message size %d, channel %d\n",uVar1,uVar2);
  uVar7 = (uint)(ushort)(uVar3 << 8 | uVar3 >> 8);
  if (uVar1 == uVar7) {
    if (4 < iVar4) {
      lVar6 = 0;
      __n = (long)(int)uVar1;
      do {
        __s2 = (long *)((long)ptr + lVar6 + 4);
        if ((long)__n < 0xd) {
          iVar4 = bcmp("$_1234\n",__s2,__n);
          if (iVar4 != 0) {
            curl_mprintf("RTP PAYLOAD END CORRUPTED (%d), [%s]\n",uVar1 - (int)lVar6,__s2);
            return sVar5;
          }
        }
        else if ((int)__s2[1] != 0x66647361 || *__s2 != 0xa343332315f24) {
          curl_mprintf("RTP PAYLOAD CORRUPTED [%s]\n",__s2);
          return sVar5;
        }
        lVar6 = lVar6 + 0xc;
        __n = __n - 0xc;
      } while (lVar6 < (int)uVar1);
    }
    rtp_packet_count = rtp_packet_count + 1;
    curl_mfprintf(_stderr,"packet count is %d\n");
    sVar5 = nmemb * size;
  }
  else {
    curl_mprintf("RTP embedded size (%d) does not match the write size (%d).\n",uVar7,uVar1);
  }
  return sVar5;
}

Assistant:

static size_t rtp_write(void *ptr, size_t size, size_t nmemb, void *stream)
{
  char *data = (char *)ptr;
  int channel = RTP_PKT_CHANNEL(data);
  int message_size;
  int coded_size = RTP_PKT_LENGTH(data);
  size_t failure = (size && nmemb) ? 0 : 1;
  int i;
  (void)stream;

  message_size = curlx_uztosi(size * nmemb) - 4;

  printf("RTP: message size %d, channel %d\n", message_size, channel);
  if(message_size != coded_size) {
    printf("RTP embedded size (%d) does not match the write size (%d).\n",
           coded_size, message_size);
    return failure;
  }

  data += 4;
  for(i = 0; i < message_size; i += RTP_DATA_SIZE) {
    if(message_size - i > RTP_DATA_SIZE) {
      if(memcmp(RTP_DATA, data + i, RTP_DATA_SIZE) != 0) {
        printf("RTP PAYLOAD CORRUPTED [%s]\n", data + i);
        return failure;
      }
    }
    else {
      if(memcmp(RTP_DATA, data + i, message_size - i) != 0) {
        printf("RTP PAYLOAD END CORRUPTED (%d), [%s]\n",
               message_size - i, data + i);
        return failure;
      }
    }
  }

  rtp_packet_count++;
  fprintf(stderr, "packet count is %d\n", rtp_packet_count);

  return size * nmemb;
}